

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O1

int nghttp2_session_update_recv_connection_window_size(nghttp2_session *session,size_t delta_size)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = session->recv_window_size;
  uVar3 = (uint)delta_size;
  if (iVar2 <= (int)(uVar3 ^ 0x7fffffff) && iVar2 <= (int)(session->local_window_size - uVar3)) {
    session->recv_window_size = iVar2 + uVar3;
    iVar2 = 0;
    if (((session->opt_flags & 1) == 0) && (iVar2 = 0, session->window_update_queued == '\0')) {
      iVar1 = nghttp2_should_send_window_update
                        (session->local_window_size,session->recv_window_size);
      if (iVar1 != 0) {
        iVar2 = nghttp2_session_add_window_update(session,'\0',0,session->recv_window_size);
        if (iVar2 == 0) {
          session->recv_window_size = 0;
          iVar2 = 0;
        }
      }
    }
    return iVar2;
  }
  iVar2 = session_terminate_session(session,session->last_proc_stream_id,3,(char *)0x0);
  return iVar2;
}

Assistant:

int nghttp2_session_update_recv_connection_window_size(nghttp2_session *session,
                                                       size_t delta_size) {
  int rv;
  rv = adjust_recv_window_size(&session->recv_window_size, delta_size,
                               session->local_window_size);
  if (rv != 0) {
    return nghttp2_session_terminate_session(session,
                                             NGHTTP2_FLOW_CONTROL_ERROR);
  }
  if (!(session->opt_flags & NGHTTP2_OPTMASK_NO_AUTO_WINDOW_UPDATE) &&
      session->window_update_queued == 0 &&
      nghttp2_should_send_window_update(session->local_window_size,
                                        session->recv_window_size)) {
    /* Use stream ID 0 to update connection-level flow control
       window */
    rv = nghttp2_session_add_window_update(session, NGHTTP2_FLAG_NONE, 0,
                                           session->recv_window_size);
    if (rv != 0) {
      return rv;
    }

    session->recv_window_size = 0;
  }
  return 0;
}